

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O0

int utf8_encode(int32_t codepoint,char *buffer,size_t *size)

{
  byte bVar1;
  size_t *size_local;
  char *buffer_local;
  int32_t codepoint_local;
  
  if (codepoint < 0) {
    buffer_local._4_4_ = -1;
  }
  else {
    bVar1 = (byte)codepoint;
    if (codepoint < 0x80) {
      *buffer = bVar1;
      *size = 1;
    }
    else if (codepoint < 0x800) {
      *buffer = (char)((int)(codepoint & 0x7c0U) >> 6) + -0x40;
      buffer[1] = (bVar1 & 0x3f) + 0x80;
      *size = 2;
    }
    else if (codepoint < 0x10000) {
      *buffer = (char)((int)(codepoint & 0xf000U) >> 0xc) + -0x20;
      buffer[1] = (char)((int)(codepoint & 0xfc0U) >> 6) + -0x80;
      buffer[2] = (bVar1 & 0x3f) + 0x80;
      *size = 3;
    }
    else {
      if (0x10ffff < codepoint) {
        return -1;
      }
      *buffer = (char)((int)(codepoint & 0x1c0000U) >> 0x12) + -0x10;
      buffer[1] = (char)((int)(codepoint & 0x3f000U) >> 0xc) + -0x80;
      buffer[2] = (char)((int)(codepoint & 0xfc0U) >> 6) + -0x80;
      buffer[3] = (bVar1 & 0x3f) + 0x80;
      *size = 4;
    }
    buffer_local._4_4_ = 0;
  }
  return buffer_local._4_4_;
}

Assistant:

int utf8_encode(int32_t codepoint, char *buffer, size_t *size) {
    if (codepoint < 0)
        return -1;
    else if (codepoint < 0x80) {
        buffer[0] = (char) codepoint;
        *size = 1;
    } else if (codepoint < 0x800) {
        buffer[0] = 0xC0 + ((codepoint & 0x7C0) >> 6);
        buffer[1] = 0x80 + ((codepoint & 0x03F));
        *size = 2;
    } else if (codepoint < 0x10000) {
        buffer[0] = 0xE0 + ((codepoint & 0xF000) >> 12);
        buffer[1] = 0x80 + ((codepoint & 0x0FC0) >> 6);
        buffer[2] = 0x80 + ((codepoint & 0x003F));
        *size = 3;
    } else if (codepoint <= 0x10FFFF) {
        buffer[0] = 0xF0 + ((codepoint & 0x1C0000) >> 18);
        buffer[1] = 0x80 + ((codepoint & 0x03F000) >> 12);
        buffer[2] = 0x80 + ((codepoint & 0x000FC0) >> 6);
        buffer[3] = 0x80 + ((codepoint & 0x00003F));
        *size = 4;
    } else
        return -1;

    return 0;
}